

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdShrink_rec(Kit_DsdNtk_t *pNew,Kit_DsdNtk_t *p,int iLit,int *pPrios)

{
  ushort uVar1;
  ushort uVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  int iVar5;
  Kit_DsdObj_t *pKVar6;
  Kit_DsdObj_t KVar7;
  ulong uVar8;
  uint *pTruth;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  uint uSupps [16];
  uint piLitsNew [16];
  uint local_b8 [16];
  uint local_78 [18];
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  uVar11 = (ulong)uVar1;
  uVar10 = (uint)p->nNodes + (uint)uVar1;
  if (uVar10 <= uVar4) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if ((uVar1 <= uVar4) && (pKVar3 = p->pNodes[uVar4 - uVar11], pKVar3 != (Kit_DsdObj_t *)0x0)) {
    KVar7 = *pKVar3;
    uVar4 = (uint)KVar7 >> 6 & 7;
    if (uVar4 == 3) {
      if (0x3ffffff < (uint)KVar7) {
        uVar8 = 0;
        do {
          uVar2 = *(ushort *)((long)&pKVar3[1].field_0x0 + uVar8 * 2) >> 1;
          if (uVar10 <= uVar2) goto LAB_005db1f0;
          if (p->pSupps == (uint *)0x0) {
            uVar4 = 0;
          }
          else if (uVar2 < uVar1) {
            uVar4 = 1 << ((byte)uVar2 & 0x1f);
          }
          else {
            uVar4 = p->pSupps[(uint)uVar2 - uVar11];
          }
          local_b8[uVar8] = uVar4;
          uVar8 = uVar8 + 1;
        } while ((uint)KVar7 >> 0x1a != uVar8);
      }
      Kit_DsdCompSort(pPrios,local_b8,(unsigned_short *)(pKVar3 + 1),(uint)KVar7 >> 0x1a,local_78);
      uVar4 = Kit_DsdShrink_rec(pNew,p,local_78[0],pPrios);
      uVar11 = 1;
      do {
        pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_AND,2);
        iVar5 = Kit_DsdShrink_rec(pNew,p,local_78[uVar11],pPrios);
        *(short *)(pKVar6 + 1) = (short)iVar5;
        *(short *)&pKVar6[1].field_0x2 = (short)uVar4;
        uVar4 = (int)*pKVar6 * 2 & 0x7e;
        uVar11 = uVar11 + 1;
      } while (uVar11 < (uint)*pKVar3 >> 0x1a);
    }
    else {
      if (uVar4 == 5) {
        pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_PRIME,(uint)KVar7 >> 0x1a);
        KVar7 = *pKVar3;
        puVar9 = (uint *)((long)&pKVar3[1].field_0x0 + (ulong)((uint)KVar7 >> 8 & 0x3fc));
        if (((uint)KVar7 & 0x1c0) != 0x140) {
          puVar9 = (uint *)0x0;
        }
        pTruth = (uint *)(&pKVar6[1].field_0x0 + ((uint)*pKVar6 >> 8 & 0x3fc));
        if (((uint)*pKVar6 & 0x1c0) != 0x140) {
          pTruth = (uint *)0x0;
        }
        uVar4 = 1 << ((KVar7._3_1_ >> 2) - 5 & 0x1f);
        if ((uint)KVar7 < 0x18000000) {
          uVar4 = 1;
        }
        if (0 < (int)uVar4) {
          uVar11 = (ulong)uVar4 + 1;
          do {
            pTruth[uVar11 - 2] = puVar9[uVar11 - 2];
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
          KVar7 = *pKVar3;
        }
        uVar11 = (ulong)((uint)KVar7 >> 0x1a);
        bVar12 = true;
        if (0x3ffffff < (uint)KVar7) {
          uVar8 = 0;
          do {
            uVar4 = Kit_DsdShrink_rec(pNew,p,(uint)*(ushort *)
                                                    ((long)&pKVar3[1].field_0x0 + uVar8 * 2),pPrios)
            ;
            *(ushort *)(&pKVar6[1].field_0x0 + uVar8 * 2) = (ushort)uVar4;
            if ((uVar4 & 1) != 0) {
              *(ushort *)(&pKVar6[1].field_0x0 + uVar8 * 2) = (ushort)uVar4 & 0xfffe;
              Kit_TruthChangePhase(pTruth,(uint)*pKVar6 >> 0x1a,(int)uVar8);
            }
            uVar8 = uVar8 + 1;
            uVar11 = (ulong)((uint)*pKVar3 >> 0x1a);
          } while (uVar8 < uVar11);
          bVar12 = (uint)*pKVar3 < 0x18000000;
        }
        if ((iLit & 1U) != 0) {
          uVar4 = 1 << ((char)uVar11 - 5U & 0x1f);
          if (bVar12) {
            uVar4 = 1;
          }
          if (0 < (int)uVar4) {
            uVar11 = (ulong)uVar4 + 1;
            do {
              pTruth[uVar11 - 2] = ~pTruth[uVar11 - 2];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
        }
        return (int)*pKVar6 * 2 & 0x7e;
      }
      if (uVar4 != 4) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x63d,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)");
      }
      if (0x3ffffff < (uint)KVar7) {
        uVar8 = 0;
        do {
          uVar2 = *(ushort *)((long)&pKVar3[1].field_0x0 + uVar8 * 2);
          if ((uVar2 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iLitFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                          ,0x62c,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)"
                         );
          }
          uVar2 = uVar2 >> 1;
          uVar4 = (uint)uVar2;
          if (uVar10 <= uVar4) {
LAB_005db1f0:
            __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                          ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
          }
          if (p->pSupps == (uint *)0x0) {
            uVar4 = 0;
          }
          else if (uVar4 < uVar1) {
            uVar4 = 1 << ((byte)uVar2 & 0x1f);
          }
          else {
            uVar4 = p->pSupps[uVar4 - uVar11];
          }
          local_b8[uVar8] = uVar4;
          uVar8 = uVar8 + 1;
        } while ((uint)KVar7 >> 0x1a != uVar8);
      }
      Kit_DsdCompSort(pPrios,local_b8,(unsigned_short *)(pKVar3 + 1),(uint)KVar7 >> 0x1a,local_78);
      uVar4 = Kit_DsdShrink_rec(pNew,p,local_78[0],pPrios);
      uVar11 = 1;
      do {
        pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_XOR,2);
        iVar5 = Kit_DsdShrink_rec(pNew,p,local_78[uVar11],pPrios);
        *(short *)(pKVar6 + 1) = (short)iVar5;
        *(short *)&pKVar6[1].field_0x2 = (short)uVar4;
        uVar4 = (int)*pKVar6 * 2 & 0x7e;
        uVar11 = uVar11 + 1;
      } while (uVar11 < (uint)*pKVar3 >> 0x1a);
    }
    iLit = iLit & 1U | uVar4;
  }
  return iLit;
}

Assistant:

int Kit_DsdShrink_rec( Kit_DsdNtk_t * pNew, Kit_DsdNtk_t * p, int iLit, int pPrios[] )
{
    Kit_DsdObj_t * pObj;
    Kit_DsdObj_t * pObjNew = NULL; // Suppress "might be used uninitialized"
    unsigned * pTruth, * pTruthNew;
    unsigned i, piLitsNew[16], uSupps[16];
    int iLitFanin, iLitNew;

    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return iLit;
    if ( pObj->Type == KIT_DSD_AND )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_AND, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            assert( !Abc_LitIsCompl(iLitFanin) );
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        }
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_XOR, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    // create new PRIME node
    pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_PRIME, pObj->nFans );
    // copy the truth table
    pTruth = Kit_DsdObjTruth( pObj );
    pTruthNew = Kit_DsdObjTruth( pObjNew );
    Kit_TruthCopy( pTruthNew, pTruth, pObj->nFans );
    // create fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        pObjNew->pFans[i] = Kit_DsdShrink_rec( pNew, p, iLitFanin, pPrios );
        // complement the corresponding inputs of the truth table
        if ( Abc_LitIsCompl(pObjNew->pFans[i]) )
        {
            pObjNew->pFans[i] = Abc_LitRegular(pObjNew->pFans[i]);
            Kit_TruthChangePhase( pTruthNew, pObjNew->nFans, i );
        }
    }
    // if the incoming phase is complemented, absorb it into the prime node
    if ( Abc_LitIsCompl(iLit) )
        Kit_TruthNot( pTruthNew, pTruthNew, pObj->nFans );
    return Abc_Var2Lit( pObjNew->Id, 0 );
}